

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::SCAtypeParameters> *this)

{
  void *in_RDI;
  
  ~SimpleTypeData((SimpleTypeData<OpenMD::SCAtypeParameters> *)0x396028);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}